

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O2

int luabridge::detail::
    Invoke<bool,luabridge::detail::TypeList<char_const*,luabridge::detail::TypeList<int,void>>,1>::
    run<bool(*)(char_const*,int)>(lua_State *L,_func_bool_char_ptr_int **fn)

{
  bool value;
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_void>_>,_1>
  args;
  
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_void>_>,_1>::
  ArgList(&args,L);
  value = (**fn)(args.
                 super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_void>_>_>
                 .hd,args.
                     super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_void>_>_>
                     .tl.hd);
  Stack<bool>::push(L,value);
  return 1;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            Stack<ReturnType>::push(L, FuncTraits<Fn>::call(fn, args));
            return 1;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }